

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlSearchNs(xmlDocPtr doc,xmlNodePtr node,xmlChar *nameSpace)

{
  xmlNsPtr pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  _xmlNode *p_Var4;
  xmlNode *orig;
  xmlNsPtr cur;
  xmlChar *nameSpace_local;
  xmlNodePtr node_local;
  xmlDocPtr doc_local;
  
  if ((node == (xmlNodePtr)0x0) || (node->type == XML_NAMESPACE_DECL)) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    nameSpace_local = (xmlChar *)node;
    if ((nameSpace == (xmlChar *)0x0) || (iVar2 = xmlStrEqual(nameSpace,"xml"), iVar2 == 0)) {
      for (; nameSpace_local != (xmlChar *)0x0;
          nameSpace_local = *(xmlChar **)(nameSpace_local + 0x28)) {
        if (((*(int *)(nameSpace_local + 8) == 5) || (*(int *)(nameSpace_local + 8) == 6)) ||
           (*(int *)(nameSpace_local + 8) == 0x11)) {
          return (xmlNsPtr)0x0;
        }
        if (*(int *)(nameSpace_local + 8) == 1) {
          for (orig = *(xmlNode **)(nameSpace_local + 0x60); orig != (xmlNode *)0x0;
              orig = (xmlNode *)orig->_private) {
            if (((orig->children == (_xmlNode *)0x0) && (nameSpace == (xmlChar *)0x0)) &&
               (orig->name != (xmlChar *)0x0)) {
              return (xmlNsPtr)orig;
            }
            if (((orig->children != (_xmlNode *)0x0) && (nameSpace != (xmlChar *)0x0)) &&
               ((orig->name != (xmlChar *)0x0 &&
                (iVar2 = xmlStrEqual((xmlChar *)orig->children,nameSpace), iVar2 != 0)))) {
              return (xmlNsPtr)orig;
            }
          }
          if ((node != (xmlNodePtr)nameSpace_local) &&
             (pxVar1 = *(xmlNsPtr *)(nameSpace_local + 0x48), pxVar1 != (xmlNsPtr)0x0)) {
            if ((pxVar1->prefix == (xmlChar *)0x0) &&
               ((nameSpace == (xmlChar *)0x0 && (pxVar1->href != (xmlChar *)0x0)))) {
              return pxVar1;
            }
            if ((((pxVar1->prefix != (xmlChar *)0x0) && (nameSpace != (xmlChar *)0x0)) &&
                (pxVar1->href != (xmlChar *)0x0)) &&
               (iVar2 = xmlStrEqual(pxVar1->prefix,nameSpace), iVar2 != 0)) {
              return pxVar1;
            }
          }
        }
      }
      doc_local = (xmlDocPtr)0x0;
    }
    else if ((doc == (xmlDocPtr)0x0) && (node->type == XML_ELEMENT_NODE)) {
      doc_local = (xmlDocPtr)(*xmlMalloc)(0x30);
      if (doc_local == (xmlDocPtr)0x0) {
        xmlTreeErrMemory("searching namespace");
        doc_local = (xmlDocPtr)0x0;
      }
      else {
        memset(doc_local,0,0x30);
        doc_local->type = XML_NAMESPACE_DECL;
        pxVar3 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
        doc_local->name = (char *)pxVar3;
        p_Var4 = (_xmlNode *)xmlStrdup("xml");
        doc_local->children = p_Var4;
        doc_local->_private = node->nsDef;
        node->nsDef = (xmlNs *)doc_local;
      }
    }
    else {
      node_local = (xmlNodePtr)doc;
      if ((doc == (xmlDocPtr)0x0) &&
         (node_local = (xmlNodePtr)node->doc, (_xmlDoc *)node_local == (_xmlDoc *)0x0)) {
        doc_local = (xmlDocPtr)0x0;
      }
      else if (node_local->nsDef == (xmlNs *)0x0) {
        doc_local = (xmlDocPtr)xmlTreeEnsureXMLDecl((xmlDocPtr)node_local);
      }
      else {
        doc_local = (xmlDocPtr)node_local->nsDef;
      }
    }
  }
  return (xmlNsPtr)doc_local;
}

Assistant:

xmlNsPtr
xmlSearchNs(xmlDocPtr doc, xmlNodePtr node, const xmlChar *nameSpace) {

    xmlNsPtr cur;
    const xmlNode *orig = node;

    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL)) return(NULL);
    if ((nameSpace != NULL) &&
	(xmlStrEqual(nameSpace, (const xmlChar *)"xml"))) {
	if ((doc == NULL) && (node->type == XML_ELEMENT_NODE)) {
	    /*
	     * The XML-1.0 namespace is normally held on the root
	     * element. In this case exceptionally create it on the
	     * node element.
	     */
	    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
	    if (cur == NULL) {
		xmlTreeErrMemory("searching namespace");
		return(NULL);
	    }
	    memset(cur, 0, sizeof(xmlNs));
	    cur->type = XML_LOCAL_NAMESPACE;
	    cur->href = xmlStrdup(XML_XML_NAMESPACE);
	    cur->prefix = xmlStrdup((const xmlChar *)"xml");
	    cur->next = node->nsDef;
	    node->nsDef = cur;
	    return(cur);
	}
	if (doc == NULL) {
	    doc = node->doc;
	    if (doc == NULL)
		return(NULL);
	}
	/*
	* Return the XML namespace declaration held by the doc.
	*/
	if (doc->oldNs == NULL)
	    return(xmlTreeEnsureXMLDecl(doc));
	else
	    return(doc->oldNs);
    }
    while (node != NULL) {
	if ((node->type == XML_ENTITY_REF_NODE) ||
	    (node->type == XML_ENTITY_NODE) ||
	    (node->type == XML_ENTITY_DECL))
	    return(NULL);
	if (node->type == XML_ELEMENT_NODE) {
	    cur = node->nsDef;
	    while (cur != NULL) {
		if ((cur->prefix == NULL) && (nameSpace == NULL) &&
		    (cur->href != NULL))
		    return(cur);
		if ((cur->prefix != NULL) && (nameSpace != NULL) &&
		    (cur->href != NULL) &&
		    (xmlStrEqual(cur->prefix, nameSpace)))
		    return(cur);
		cur = cur->next;
	    }
	    if (orig != node) {
	        cur = node->ns;
	        if (cur != NULL) {
		    if ((cur->prefix == NULL) && (nameSpace == NULL) &&
		        (cur->href != NULL))
		        return(cur);
		    if ((cur->prefix != NULL) && (nameSpace != NULL) &&
		        (cur->href != NULL) &&
		        (xmlStrEqual(cur->prefix, nameSpace)))
		        return(cur);
	        }
	    }
	}
	node = node->parent;
    }
    return(NULL);
}